

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask5_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 5 | uVar2;
  *out = uVar2;
  uVar2 = in[2] << 10 | uVar2;
  *out = uVar2;
  uVar2 = in[3] << 0xf | uVar2;
  *out = uVar2;
  uVar2 = in[4] << 0x14 | uVar2;
  *out = uVar2;
  uVar2 = in[5] << 0x19 | uVar2;
  *out = uVar2;
  uVar1 = in[6];
  *out = uVar1 << 0x1e | uVar2;
  uVar1 = uVar1 >> 2;
  out[1] = uVar1;
  out[1] = in[7] << 3 | uVar1;
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask5_8(const uint32_t *__restrict__ in,
                                   uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 25;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (5 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;

  return out + 1;
}